

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

Value<google::protobuf::internal::GenericTypeHandler<std::string>_> * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this,int index)

{
  void **ppvVar1;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *extraout_RAX;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar2;
  long *plVar3;
  undefined1 local_10 [16];
  
  if (index < 0) {
    index = (int)local_10;
    Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>();
  }
  else if (index < this->current_size_) {
    ppvVar1 = element_at(this,index);
    return (Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *)*ppvVar1;
  }
  plVar3 = (long *)(ulong)(uint)index;
  Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>();
  if (plVar3 != (long *)0x0) {
    pVVar2 = (Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *)
             (**(code **)(*plVar3 + 8))();
    return pVVar2;
  }
  return extraout_RAX;
}

Assistant:

Value<TypeHandler>* Mutable(int index) {
    ABSL_DCHECK_GE(index, 0);
    ABSL_DCHECK_LT(index, current_size_);
    return cast<TypeHandler>(element_at(index));
  }